

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.h
# Opt level: O3

void __thiscall cmFileCopier::MatchRule::MatchRule(MatchRule *this,string *regex)

{
  pointer pcVar1;
  
  (this->Regex).regmust = (char *)0x0;
  (this->Regex).program = (char *)0x0;
  (this->Regex).progsize = 0;
  memset(this,0,0x20a);
  cmsys::RegularExpression::compile(&this->Regex,(regex->_M_dataplus)._M_p);
  (this->Properties).Exclude = false;
  (this->Properties).Permissions = 0;
  (this->RegexString)._M_dataplus._M_p = (pointer)&(this->RegexString).field_2;
  pcVar1 = (regex->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->RegexString,pcVar1,pcVar1 + regex->_M_string_length);
  return;
}

Assistant:

MatchRule(std::string const& regex)
      : Regex(regex)
      , RegexString(regex)
    {
    }